

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::X3DExporter
          (X3DExporter *this,char *pFileName,IOSystem *pIOSystem,aiScene *pScene,
          ExportProperties *param_4)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  undefined4 extraout_var;
  _Node *p_Var5;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  undefined1 local_b0 [32];
  _Alloc_hider local_90;
  char local_80 [23];
  allocator local_69;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->mScene = pScene;
  p_Var1 = &(this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header;
  (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header;
  (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mIndentationString)._M_dataplus._M_p = (pointer)&(this->mIndentationString).field_2;
  (this->mIndentationString)._M_string_length = 0;
  (this->mIndentationString).field_2._M_local_buf[0] = '\0';
  local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
  local_68._M_impl._M_node._M_size = 0;
  local_68._M_impl._M_node.super__List_node_base._M_prev =
       local_68._M_impl._M_node.super__List_node_base._M_next;
  iVar4 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFileName,"wt");
  this->mOutFile = (IOStream *)CONCAT44(extraout_var,iVar4);
  if ((IOStream *)CONCAT44(extraout_var,iVar4) != (IOStream *)0x0) {
    pcVar2 = local_b0 + 0x10;
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n","");
    XML_Write(this,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,
               "<!DOCTYPE X3D PUBLIC \"ISO//Web3D//DTD X3D 3.3//EN\" \"http://www.web3d.org/specifications/x3d-3.3.dtd\">\n"
               ,"");
    XML_Write(this,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"profile","");
    local_90._M_p = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Interchange","");
    p_Var5 = std::__cxx11::
             list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
             ::_M_create_node<Assimp::X3DExporter::SAttribute>
                       ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_68,(SAttribute *)local_b0);
    std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
    local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
    if (local_90._M_p != local_80) {
      operator_delete(local_90._M_p);
    }
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"version","");
    local_90._M_p = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"3.3","");
    p_Var5 = std::__cxx11::
             list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
             ::_M_create_node<Assimp::X3DExporter::SAttribute>
                       ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_68,(SAttribute *)local_b0);
    std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
    local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
    if (local_90._M_p != local_80) {
      operator_delete(local_90._M_p);
    }
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"xmlns:xsd","");
    local_90._M_p = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"http://www.w3.org/2001/XMLSchema-instance","");
    p_Var5 = std::__cxx11::
             list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
             ::_M_create_node<Assimp::X3DExporter::SAttribute>
                       ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_68,(SAttribute *)local_b0);
    std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
    local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
    if (local_90._M_p != local_80) {
      operator_delete(local_90._M_p);
    }
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"xsd:noNamespaceSchemaLocation","");
    local_90._M_p = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"http://www.web3d.org/specifications/x3d-3.3.xsd","");
    p_Var5 = std::__cxx11::
             list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
             ::_M_create_node<Assimp::X3DExporter::SAttribute>
                       ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_68,(SAttribute *)local_b0);
    std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
    local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
    if (local_90._M_p != local_80) {
      operator_delete(local_90._M_p);
    }
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"X3D","");
    NodeHelper_OpenNode(this,(string *)local_b0,0,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_68);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_68);
    local_68._M_impl._M_node._M_size = 0;
    local_b0._0_8_ = pcVar2;
    local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
    local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"head","");
    NodeHelper_OpenNode(this,(string *)local_b0,1,false);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    pcVar3 = (this->mIndentationString)._M_dataplus._M_p;
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar3,pcVar3 + (this->mIndentationString)._M_string_length);
    std::__cxx11::string::append(local_b0);
    XML_Write(this,(string *)local_b0);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"head","");
    NodeHelper_CloseNode(this,(string *)local_b0,1);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Scene","");
    NodeHelper_OpenNode(this,(string *)local_b0,1,false);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    Export_Node(this,this->mScene->mRootNode,2);
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Scene","");
    NodeHelper_CloseNode(this,(string *)local_b0,1);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"X3D","");
    NodeHelper_CloseNode(this,(string *)local_b0,0);
    if ((pointer)local_b0._0_8_ != pcVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    (*pIOSystem->_vptr_IOSystem[5])(pIOSystem,this->mOutFile);
    this->mOutFile = (IOStream *)0x0;
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_68);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_50,pFileName,&local_69);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 "Could not open output .x3d file: ",&local_50);
  std::runtime_error::runtime_error(this_00,(string *)local_b0);
  *(undefined ***)this_00 = &PTR__runtime_error_00900168;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

X3DExporter::X3DExporter(const char* pFileName, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
	: mScene(pScene)
{
list<SAttribute> attr_list;

	mOutFile = pIOSystem->Open(pFileName, "wt");
	if(mOutFile == nullptr) throw DeadlyExportError("Could not open output .x3d file: " + string(pFileName));

	// Begin document
	XML_Write("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
	XML_Write("<!DOCTYPE X3D PUBLIC \"ISO//Web3D//DTD X3D 3.3//EN\" \"http://www.web3d.org/specifications/x3d-3.3.dtd\">\n");
	// Root node
	attr_list.push_back({"profile", "Interchange"});
	attr_list.push_back({"version", "3.3"});
	attr_list.push_back({"xmlns:xsd", "http://www.w3.org/2001/XMLSchema-instance"});
	attr_list.push_back({"xsd:noNamespaceSchemaLocation", "http://www.web3d.org/specifications/x3d-3.3.xsd"});
	NodeHelper_OpenNode("X3D", 0, false, attr_list);
	attr_list.clear();
	// <head>: meta data.
	NodeHelper_OpenNode("head", 1);
	XML_Write(mIndentationString + "<!-- All \"meta\" from this section tou will found in <Scene> node as MetadataString nodes. -->\n");
	NodeHelper_CloseNode("head", 1);
	// Scene node.
	NodeHelper_OpenNode("Scene", 1);
	Export_Node(mScene->mRootNode, 2);
	NodeHelper_CloseNode("Scene", 1);
	// Close Root node.
	NodeHelper_CloseNode("X3D", 0);
	// Cleanup
	pIOSystem->Close(mOutFile);
	mOutFile = nullptr;
}